

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluPixelTransfer.cpp
# Opt level: O0

void glu::texSubImage2D(RenderContext *context,deUint32 target,int level,int x,int y,
                       ConstPixelBufferAccess *src)

{
  code *pcVar1;
  int iVar2;
  deBool dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  InternalError *pIVar7;
  TextureFormat *pTVar8;
  TransferFormat TVar9;
  void *pvVar10;
  deUint32 local_54;
  deUint32 dStack_50;
  TransferFormat format;
  int height;
  int width;
  Functions *gl;
  ConstPixelBufferAccess *src_local;
  int y_local;
  int x_local;
  int level_local;
  deUint32 target_local;
  RenderContext *context_local;
  
  iVar2 = (*context->_vptr_RenderContext[3])();
  do {
    dVar3 = ::deGetFalse();
    if ((dVar3 != 0) || (iVar4 = tcu::ConstPixelBufferAccess::getDepth(src), iVar4 != 1)) {
      pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (pIVar7,(char *)0x0,"src.getDepth() == 1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluPixelTransfer.cpp"
                 ,0x6f);
      __cxa_throw(pIVar7,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  while (dVar3 = ::deGetFalse(), dVar3 == 0) {
    iVar4 = tcu::ConstPixelBufferAccess::getRowPitch(src);
    pTVar8 = tcu::ConstPixelBufferAccess::getFormat(src);
    iVar5 = tcu::TextureFormat::getPixelSize(pTVar8);
    iVar6 = tcu::ConstPixelBufferAccess::getWidth(src);
    if (iVar4 != iVar5 * iVar6) break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      iVar4 = tcu::ConstPixelBufferAccess::getWidth(src);
      iVar5 = tcu::ConstPixelBufferAccess::getHeight(src);
      pTVar8 = tcu::ConstPixelBufferAccess::getFormat(src);
      TVar9 = getTransferFormat(*pTVar8);
      pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0xff0);
      pTVar8 = tcu::ConstPixelBufferAccess::getFormat(src);
      iVar6 = getTransferAlignment(*pTVar8);
      (*pcVar1)(0xcf5,iVar6);
      pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x13b8);
      local_54 = TVar9.format;
      dStack_50 = TVar9.dataType;
      pvVar10 = tcu::ConstPixelBufferAccess::getDataPtr(src);
      (*pcVar1)(target,level,x,y,iVar4,iVar5,local_54,dStack_50,pvVar10);
      return;
    }
  }
  pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (pIVar7,(char *)0x0,"src.getRowPitch() == src.getFormat().getPixelSize()*src.getWidth()"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluPixelTransfer.cpp"
             ,0x70);
  __cxa_throw(pIVar7,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

void texSubImage2D (const RenderContext& context, deUint32 target, int level, int x, int y, const tcu::ConstPixelBufferAccess& src)
{
	const glw::Functions& gl = context.getFunctions();

	TCU_CHECK_INTERNAL(src.getDepth() == 1);
	TCU_CHECK_INTERNAL(src.getRowPitch() == src.getFormat().getPixelSize()*src.getWidth());

	int				width		= src.getWidth();
	int				height		= src.getHeight();
	TransferFormat	format		= getTransferFormat(src.getFormat());

	gl.pixelStorei(GL_UNPACK_ALIGNMENT, getTransferAlignment(src.getFormat()));
	gl.texSubImage2D(target, level, x, y, width, height, format.format, format.dataType, src.getDataPtr());
}